

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  uint uVar3;
  stbi__context *s;
  byte *pbVar4;
  int iVar5;
  stbi_uc sVar6;
  uint uVar7;
  stbi__uint32 sVar8;
  int iVar9;
  uint uVar10;
  stbi_uc *psVar11;
  void *pvVar12;
  stbi_uc *psVar13;
  long lVar14;
  short *psVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  stbi_uc **ppsVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int *piVar25;
  bool bVar26;
  
  s = z->s;
  uVar7 = stbi__get16be(s);
  if (uVar7 < 0xb) {
    stbi__g_failure_reason = "bad SOF len";
    return 0;
  }
  psVar11 = s->img_buffer;
  if (psVar11 < s->img_buffer_end) {
    s->img_buffer = psVar11 + 1;
    sVar6 = *psVar11;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00113afe;
    psVar11 = s->buffer_start;
    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
    if (iVar9 == 0) {
      s->read_from_callbacks = 0;
      psVar13 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar6 = '\0';
    }
    else {
      psVar13 = psVar11 + iVar9;
      sVar6 = *psVar11;
    }
    s->img_buffer_end = psVar13;
    s->img_buffer = s->buffer_start + 1;
  }
  if (sVar6 != '\b') {
LAB_00113afe:
    stbi__g_failure_reason = "only 8-bit";
    return 0;
  }
  sVar8 = stbi__get16be(s);
  s->img_y = sVar8;
  if (sVar8 == 0) {
    stbi__g_failure_reason = "no header height";
    return 0;
  }
  sVar8 = stbi__get16be(s);
  s->img_x = sVar8;
  if (sVar8 == 0) {
    stbi__g_failure_reason = "0 width";
    return 0;
  }
  pbVar4 = s->img_buffer;
  psVar11 = s->img_buffer_end;
  if (pbVar4 < psVar11) {
    psVar13 = pbVar4 + 1;
    s->img_buffer = psVar13;
    bVar16 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00113dac;
    psVar13 = s->buffer_start;
    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
    if (iVar9 == 0) {
      s->read_from_callbacks = 0;
      psVar11 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar16 = 0;
    }
    else {
      psVar11 = psVar13 + iVar9;
      bVar16 = *psVar13;
    }
    s->img_buffer_end = psVar11;
    psVar13 = s->buffer_start + 1;
    s->img_buffer = psVar13;
  }
  if ((bVar16 & 0xfd) == 1) {
    uVar17 = (uint)bVar16;
    s->img_n = uVar17;
    uVar19 = (ulong)uVar17;
    ppsVar20 = &z->img_comp[0].linebuf;
    do {
      ppsVar20[-3] = (stbi_uc *)0x0;
      *ppsVar20 = (stbi_uc *)0x0;
      ppsVar20 = ppsVar20 + 0xc;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
    if (uVar7 != uVar17 * 3 + 8) {
      stbi__g_failure_reason = "bad SOF len";
      return 0;
    }
    psVar1 = s->buffer_start;
    psVar2 = s->buffer_start + 1;
    piVar25 = &z->img_comp[0].tq;
    uVar19 = 0;
    while( true ) {
      uVar7 = s->img_n;
      lVar18 = (long)(int)uVar7;
      if (lVar18 <= (long)uVar19) {
        if (scan != 0) {
          return 1;
        }
        uVar17 = s->img_x;
        uVar3 = s->img_y;
        if ((uint)((0x40000000 / (ulong)uVar17) / (ulong)uVar7) < uVar3) {
          stbi__g_failure_reason = "too large";
          return 0;
        }
        uVar21 = 1;
        uVar19 = 1;
        if (0 < (int)uVar7) {
          uVar19 = 1;
          lVar14 = 0;
          uVar21 = 1;
          do {
            uVar10 = *(uint *)((long)&z->img_comp[0].h + lVar14);
            uVar22 = *(uint *)((long)&z->img_comp[0].v + lVar14);
            if ((int)uVar21 < (int)uVar10) {
              uVar21 = (ulong)uVar10;
            }
            if ((int)uVar19 < (int)uVar22) {
              uVar19 = (ulong)uVar22;
            }
            lVar14 = lVar14 + 0x60;
          } while (lVar18 * 0x60 != lVar14);
        }
        iVar9 = (int)uVar21;
        iVar5 = (int)uVar19;
        uVar22 = ((uVar17 + iVar9 * 8) - 1) / (uint)(iVar9 * 8);
        uVar10 = ((uVar3 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
        z->img_h_max = iVar9;
        z->img_v_max = iVar5;
        z->img_mcu_w = iVar9 * 8;
        z->img_mcu_h = iVar5 * 8;
        z->img_mcu_x = uVar22;
        z->img_mcu_y = uVar10;
        if (0 < (int)uVar7) {
          piVar25 = &z->img_comp[0].coeff_h;
          lVar14 = 1;
          do {
            piVar25[-0x10] = (int)((piVar25[-0x16] * uVar17 + iVar9 + -1) / uVar21);
            piVar25[-0xf] = (int)((piVar25[-0x15] * uVar3 + iVar5 + -1) / uVar19);
            iVar24 = piVar25[-0x16] * uVar22;
            piVar25[-0xe] = iVar24 * 8;
            iVar23 = piVar25[-0x15] * uVar10;
            piVar25[-0xd] = iVar23 * 8;
            pvVar12 = malloc((long)(int)(iVar23 * 8 * iVar24 * 8 | 0xf));
            *(void **)(piVar25 + -9) = pvVar12;
            if (pvVar12 == (void *)0x0) {
              if (lVar14 == 1) {
                stbi__g_failure_reason = "outofmem";
                return 0;
              }
              do {
                uVar7 = (int)lVar14 - 2;
                free(z->img_comp[uVar7].raw_data);
                z->img_comp[uVar7].data = (stbi_uc *)0x0;
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            *(stbi_uc **)(piVar25 + -0xb) = (stbi_uc *)((long)pvVar12 + 0xfU & 0xfffffffffffffff0);
            *(stbi_uc **)(piVar25 + -5) = (stbi_uc *)0x0;
            if (z->progressive == 0) {
              psVar15 = (short *)0x0;
              pvVar12 = (void *)0x0;
            }
            else {
              piVar25[-1] = iVar24;
              *piVar25 = iVar23;
              pvVar12 = malloc((long)(iVar24 * iVar23 * 0x40) * 2 + 0xf);
              psVar15 = (short *)((long)pvVar12 + 0xfU & 0xfffffffffffffff0);
            }
            *(short **)(piVar25 + -3) = psVar15;
            *(void **)(piVar25 + -7) = pvVar12;
            piVar25 = piVar25 + 0x18;
            bVar26 = lVar14 != lVar18;
            lVar14 = lVar14 + 1;
          } while (bVar26);
          return 1;
        }
        return 1;
      }
      if (psVar13 < psVar11) {
        s->img_buffer = psVar13 + 1;
        bVar16 = *psVar13;
        psVar13 = psVar13 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar16 = 0;
      }
      else {
        iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar9 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar16 = 0;
          psVar11 = psVar2;
        }
        else {
          bVar16 = *psVar1;
          psVar11 = psVar1 + iVar9;
        }
        s->img_buffer_end = psVar11;
        s->img_buffer = psVar2;
        psVar13 = psVar2;
      }
      ((anon_struct_96_18_0d0905d3 *)(piVar25 + -3))->id = (uint)bVar16;
      if (uVar19 + 1 != (ulong)bVar16 && uVar19 != bVar16) {
        stbi__g_failure_reason = "bad component ID";
        return 0;
      }
      if (psVar13 < psVar11) {
        s->img_buffer = psVar13 + 1;
        bVar16 = *psVar13;
        psVar13 = psVar13 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) {
          piVar25[-2] = 0;
          stbi__g_failure_reason = "bad H";
          return 0;
        }
        iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar9 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar16 = 0;
          psVar11 = psVar2;
        }
        else {
          bVar16 = *psVar1;
          psVar11 = psVar1 + iVar9;
        }
        s->img_buffer_end = psVar11;
        s->img_buffer = psVar2;
        psVar13 = psVar2;
      }
      piVar25[-2] = (uint)(bVar16 >> 4);
      if ((byte)(bVar16 + 0xb0) < 0xc0) break;
      piVar25[-1] = bVar16 & 0xf;
      if ((bVar16 & 0xf) - 5 < 0xfffffffc) {
        stbi__g_failure_reason = "bad V";
        return 0;
      }
      if (psVar13 < psVar11) {
        s->img_buffer = psVar13 + 1;
        bVar16 = *psVar13;
        psVar13 = psVar13 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar16 = 0;
      }
      else {
        iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar9 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar16 = 0;
          psVar11 = psVar2;
        }
        else {
          bVar16 = *psVar1;
          psVar11 = psVar1 + iVar9;
        }
        s->img_buffer_end = psVar11;
        s->img_buffer = psVar2;
        psVar13 = psVar2;
      }
      *piVar25 = (uint)bVar16;
      piVar25 = piVar25 + 0x18;
      uVar19 = uVar19 + 1;
      if (3 < bVar16) {
        stbi__g_failure_reason = "bad TQ";
        return 0;
      }
    }
    stbi__g_failure_reason = "bad H";
    return 0;
  }
LAB_00113dac:
  stbi__g_failure_reason = "bad component count";
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1) return stbi__err("bad component count","Corrupt JPEG");    // JFIF requires
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   for (i=0; i < s->img_n; ++i) {
      z->img_comp[i].id = stbi__get8(s);
      if (z->img_comp[i].id != i+1)   // JFIF requires
         if (z->img_comp[i].id != i)  // some version of jpegtran outputs non-JFIF-compliant files!
            return stbi__err("bad component ID","Corrupt JPEG");
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].raw_data = stbi__malloc(z->img_comp[i].w2 * z->img_comp[i].h2+15);

      if (z->img_comp[i].raw_data == NULL) {
         for(--i; i >= 0; --i) {
            STBI_FREE(z->img_comp[i].raw_data);
            z->img_comp[i].data = NULL;
         }
         return stbi__err("outofmem", "Out of memory");
      }
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      z->img_comp[i].linebuf = NULL;
      if (z->progressive) {
         z->img_comp[i].coeff_w = (z->img_comp[i].w2 + 7) >> 3;
         z->img_comp[i].coeff_h = (z->img_comp[i].h2 + 7) >> 3;
         z->img_comp[i].raw_coeff = STBI_MALLOC(z->img_comp[i].coeff_w * z->img_comp[i].coeff_h * 64 * sizeof(short) + 15);
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      } else {
         z->img_comp[i].coeff = 0;
         z->img_comp[i].raw_coeff = 0;
      }
   }

   return 1;
}